

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Reverb::render(V2Reverb *this,StereoSample *dest,int nsamples)

{
  uint uVar1;
  V2Instance *pVVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *puVar8;
  int j;
  ulong uVar9;
  int ch;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pVVar2 = this->inst;
  uVar3 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar3 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    fVar12 = pVVar2->aux1buf[uVar7] * this->gainin + 3.8146973e-06;
    lVar4 = 0;
    puVar8 = &this->field_0xc8;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      fVar13 = 0.0;
      lVar11 = lVar4;
      for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
        fVar15 = fVar12;
        if ((uVar9 & 1) != 0) {
          fVar15 = -fVar12;
        }
        fVar5 = this->gaina[lVar11 + 6];
        fVar14 = *(float *)((long)this->combl[0] + lVar11);
        fVar14 = ((this->gainc[uVar9] *
                   *(float *)(*(long *)(this->gaina + lVar11 + 8) + (ulong)(uint)fVar5 * 4) + fVar15
                  ) - fVar14) * this->damp + fVar14;
        *(float *)(*(long *)(this->gaina + lVar11 + 8) + (ulong)(uint)fVar5 * 4) = fVar14;
        fVar5 = (float)((int)fVar5 + 1);
        if (fVar5 == this->gaina[lVar11 + 7]) {
          fVar5 = 0.0;
        }
        this->gaina[lVar11 + 6] = fVar5;
        fVar13 = fVar13 + fVar14;
        lVar11 = lVar11 + 4;
      }
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 4) {
        uVar1 = *(uint *)(puVar8 + lVar11 * 4);
        fVar15 = *(float *)(*(long *)(puVar8 + lVar11 * 4 + 8) + (ulong)uVar1 * 4);
        fVar13 = *(float *)((long)this->gaina + lVar11) * fVar15 + fVar13;
        *(float *)(*(long *)(puVar8 + lVar11 * 4 + 8) + (ulong)uVar1 * 4) = fVar13;
        iVar6 = uVar1 + 1;
        if (iVar6 == *(int *)(puVar8 + lVar11 * 4 + 4)) {
          iVar6 = 0;
        }
        *(int *)(puVar8 + lVar11 * 4) = iVar6;
        fVar13 = fVar15 - fVar13 * *(float *)((long)this->gaina + lVar11);
      }
      fVar15 = (fVar13 - this->hpf[lVar10]) * this->lowcut + this->hpf[lVar10];
      this->hpf[lVar10] = fVar15;
      dest->ch[uVar7 * 2 + lVar10] = (fVar13 - fVar15) + dest->ch[uVar7 * 2 + lVar10];
      lVar4 = lVar4 + 0x10;
      puVar8 = puVar8 + 0x20;
    }
  }
  return;
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        const float *inbuf = inst->aux1buf;

        COVER("RVB render");

        for (int i=0; i < nsamples; i++)
        {
            float in = inbuf[i] * gainin + fcdcoffset;

            for (int ch=0; ch < 2; ch++)
            {
                // parallel comb filters
                float cur = 0.0f;
                for (int j=0; j < 4; j++)
                {
                    float dv = gainc[j] * combd[ch][j].fetch();
                    float nv = (j & 1) ? (dv - in) : (dv + in); // alternate phase on combs
                    float lp = combl[ch][j] + damp * (nv - combl[ch][j]);
                    combd[ch][j].feed(lp);
                    cur += lp;
                }

                // serial allpass filters
                for (int j=0; j < 2; j++)
                {
                    float dv = alld[ch][j].fetch();
                    float dz = cur + gaina[j] * dv;
                    alld[ch][j].feed(dz);
                    cur = dv - gaina[j] * dz;
                }

                // low cut and output
                hpf[ch] += lowcut * (cur - hpf[ch]);
                dest[i].ch[ch] += cur - hpf[ch];
            }
        }
    }